

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_deleteCols(HModel *this,int firstcol,int lastcol)

{
  value_type vVar1;
  value_type vVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  int col_1;
  int el;
  int elStep;
  int elOs;
  int col;
  int colStep;
  uint local_28;
  int local_24;
  uint local_18;
  
  printf("Called model.util_deleteCols(firstcol=%d, lastcol=%d)\n",(ulong)in_ESI,(ulong)in_EDX);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  iVar4 = (in_EDX - in_ESI) + 1;
  for (local_18 = in_ESI; (int)local_18 < *(int *)(in_RDI + 0x60c) - iVar4; local_18 = local_18 + 1)
  {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),
                        (long)(int)(local_18 + iVar4));
    vVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),
                        (long)(int)local_18);
    *pvVar6 = vVar1;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                        (long)(int)(local_18 + iVar4));
    vVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                        (long)(int)local_18);
    *pvVar6 = vVar1;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                        (long)(int)(local_18 + iVar4));
    vVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                        (long)(int)local_18);
    *pvVar6 = vVar1;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6d8),
                        (long)(int)(local_18 + iVar4));
    vVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6d8),
                        (long)(int)local_18);
    *pvVar6 = vVar1;
  }
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(int)in_ESI);
  iVar5 = *pvVar7;
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(int)(in_EDX + 1))
  ;
  iVar5 = *pvVar7 - iVar5;
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(int)(in_EDX + 1))
  ;
  for (local_24 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                          (long)*(int *)(in_RDI + 0x60c)), local_28 = in_ESI, local_24 < *pvVar7;
      local_24 = local_24 + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_24);
    vVar2 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),
                        (long)(local_24 - iVar5));
    *pvVar7 = vVar2;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),(long)local_24);
    vVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                        (long)(local_24 - iVar5));
    *pvVar6 = vVar1;
  }
  for (; (int)local_28 <= *(int *)(in_RDI + 0x60c) - iVar4; local_28 = local_28 + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                        (long)(int)(local_28 + iVar4));
    iVar3 = *pvVar7;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(int)local_28);
    *pvVar7 = iVar3 - iVar5;
  }
  *(int *)(in_RDI + 0x60c) = *(int *)(in_RDI + 0x60c) - iVar4;
  *(int *)(in_RDI + 0x614) = *(int *)(in_RDI + 0x614) - iVar4;
  *(undefined4 *)(in_RDI + 0x5e4) = 0;
  *(undefined4 *)(in_RDI + 0x5e8) = 0;
  return;
}

Assistant:

void HModel::util_deleteCols(int firstcol, int lastcol) {
  assert(firstcol >= 0);
  assert(lastcol < numCol);
  assert(firstcol <= lastcol);
#ifdef JAJH_dev
  printf("Called model.util_deleteCols(firstcol=%d, lastcol=%d)\n", firstcol, lastcol);cout << flush;
#endif
  int colStep = lastcol-firstcol+1;
  for (int col = firstcol; col < numCol-colStep; col++) {
    //    printf("Copy from colCost[%d] to colCost[%d]\n", col+colStep, col);cout << flush;
    colCost[col] = colCost[col+colStep];
    colLower[col] = colLower[col+colStep];
    colUpper[col] = colUpper[col+colStep];
    colScale[col] = colScale[col+colStep];
  }
  int elOs = Astart[firstcol];
  int elStep = Astart[lastcol+1]-elOs;
  //    printf("El loop over cols %2d [%2d] to %2d [%2d]\n", lastcol+1, Astart[lastcol+1], numCol+1, Astart[numCol]-1);
  for (int el = Astart[lastcol+1]; el < Astart[numCol]; el++) {
    //        printf("Over-write entry %3d [%3d] by entry %3d [%3d]\n", el-elStep, Aindex[el-elStep], el, Aindex[el]);
    Aindex[el-elStep] = Aindex[el];
    Avalue[el-elStep] = Avalue[el];
  }
    
  for (int col = firstcol; col <= numCol-colStep; col++) {
    //    printf("Over-write start %3d [%3d] by entry %3d [%3d]\n", col, Astart[col], col+colStep,  Astart[col+colStep]-elStep);
    Astart[col] = Astart[col+colStep]-elStep;}
  
  //Reduce the number of columns and total number of variables in the model
  numCol -= colStep;
  numTot -= colStep;

  //ToDo Determine consequences for basis when deleting columns
  //Invalidate matrix copies
  mlFg_haveMatrixColWise = 0;
  mlFg_haveMatrixRowWise = 0;
}